

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::internal::BenchmarkImp::Threads(BenchmarkImp *this,int t)

{
  iterator __position;
  int local_1c;
  CheckHandler local_18;
  
  local_1c = t;
  if (0 < t) {
    GetNullLogInstance();
    __position._M_current =
         (this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->thread_counts_,__position,&local_1c);
    }
    else {
      *__position._M_current = local_1c;
      (this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    return;
  }
  CheckHandler::CheckHandler
            (&local_18,"(t) > (0)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
             ,"Threads",0x1d9);
  CheckHandler::~CheckHandler(&local_18);
}

Assistant:

void BenchmarkImp::Threads(int t) {
  CHECK_GT(t, 0);
  thread_counts_.push_back(t);
}